

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Instruction::UpdateDebugInlinedAt(Instruction *this,uint32_t new_inlined_at)

{
  pointer pIVar1;
  bool bVar2;
  Instruction *i;
  pointer pIVar3;
  DebugInfoManager *this_00;
  
  (this->dbg_scope_).inlined_at_ = new_inlined_at;
  pIVar1 = (this->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar3 = (this->dbg_line_insts_).
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1) {
    (pIVar3->dbg_scope_).inlined_at_ = new_inlined_at;
  }
  bVar2 = IsLineInst(this);
  if ((!bVar2) && ((this->context_->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone)) {
    this_00 = IRContext::get_debug_info_mgr(this->context_);
    analysis::DebugInfoManager::AnalyzeDebugInst(this_00,this);
    return;
  }
  return;
}

Assistant:

void Instruction::UpdateDebugInlinedAt(uint32_t new_inlined_at) {
  dbg_scope_.SetInlinedAt(new_inlined_at);
  for (auto& i : dbg_line_insts_) {
    i.dbg_scope_.SetInlinedAt(new_inlined_at);
  }
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}